

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlBegin(int mode)

{
  int iVar1;
  uint uVar2;
  rlDrawCall *prVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  rlRenderBatch *batch;
  
  prVar3 = (RLGL.currentBatch)->draws;
  iVar6 = (RLGL.currentBatch)->drawCounter;
  iVar1 = prVar3[(long)iVar6 + -1].mode;
  if (iVar1 != mode) {
    uVar2 = prVar3[(long)iVar6 + -1].vertexCount;
    batch = RLGL.currentBatch;
    if (0 < (int)uVar2) {
      if (iVar1 == 4) {
        uVar5 = 1;
        if (3 < uVar2) {
          uVar5 = 4 - (uVar2 & 3);
        }
      }
      else {
        uVar5 = 0;
        if (iVar1 == 1) {
          uVar5 = uVar2 & 3;
        }
      }
      prVar3[(long)iVar6 + -1].vertexAlignment = uVar5;
      _Var4 = rlCheckRenderBatchLimit
                        ((RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].
                         vertexAlignment);
      batch = RLGL.currentBatch;
      if (_Var4) {
        iVar6 = (RLGL.currentBatch)->drawCounter;
      }
      else {
        RLGL.State.vertexCounter =
             RLGL.State.vertexCounter +
             (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].vertexAlignment
        ;
        iVar6 = (RLGL.currentBatch)->drawCounter + 1;
        (RLGL.currentBatch)->drawCounter = iVar6;
      }
    }
    if (0xff < iVar6) {
      rlDrawRenderBatch(batch);
      iVar6 = (RLGL.currentBatch)->drawCounter;
      batch = RLGL.currentBatch;
    }
    batch->draws[(long)iVar6 + -1].mode = mode;
    (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].vertexCount = 0;
    (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].textureId =
         RLGL.State.defaultTextureId;
  }
  return;
}

Assistant:

void rlBegin(int mode)
{
    // Draw mode can be RL_LINES, RL_TRIANGLES and RL_QUADS
    // NOTE: In all three cases, vertex are accumulated over default internal vertex buffer
    if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode != mode)
    {
        if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount > 0)
        {
            // Make sure current RLGL.currentBatch->draws[i].vertexCount is aligned a multiple of 4,
            // that way, following QUADS drawing will keep aligned with index processing
            // It implies adding some extra alignment vertex at the end of the draw,
            // those vertex are not processed but they are considered as an additional offset
            // for the next set of vertex to be drawn
            if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode == RL_LINES) RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount < 4)? RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount : RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount%4);
            else if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode == RL_TRIANGLES) RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount < 4)? 1 : (4 - (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount%4)));
            else RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment = 0;

            if (!rlCheckRenderBatchLimit(RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment))
            {
                RLGL.State.vertexCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment;
                RLGL.currentBatch->drawCounter++;
            }
        }

        if (RLGL.currentBatch->drawCounter >= RL_DEFAULT_BATCH_DRAWCALLS) rlDrawRenderBatch(RLGL.currentBatch);

        RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode = mode;
        RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount = 0;
        RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].textureId = RLGL.State.defaultTextureId;
    }
}